

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd_b<unsigned_char>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  byte *pbVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  uchar **ppuVar7;
  long lVar8;
  ulong uVar9;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  undefined1 auVar10 [16];
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  array<unsigned_long,_3UL> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  size_t local_40;
  uchar **local_38;
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
    return;
  }
  local_38 = sorted;
  bVar3 = pseudo_median<unsigned_char>(strings,N,depth);
  local_58 = 0;
  std::array<unsigned_long,_3UL>::fill(&local_70,&local_58);
  uVar9 = N & 0xfffffffffffffff0;
  auVar10 = ZEXT216(CONCAT11(bVar3 + 0x80,bVar3 + 0x80));
  auVar10 = pshuflw(auVar10,auVar10,0);
  ppuVar7 = strings;
  for (uVar6 = 0; uVar6 < uVar9; uVar6 = uVar6 + 0x10) {
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    }
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      *(uchar *)((long)&local_58 + lVar8) = ppuVar7[lVar8][depth];
    }
    bVar4 = auVar10[0];
    bVar11 = auVar10[1];
    bVar12 = auVar10[2];
    bVar13 = auVar10[3];
    pbVar1 = oracle + uVar6;
    *pbVar1 = -((char)bVar4 < (char)((byte)local_58 ^ 0x80)) & 2U |
              -(((byte)local_58 ^ 0x80) == bVar4) & 1U;
    pbVar1[1] = -((char)bVar11 < (char)(local_58._1_1_ ^ 0x80)) & 2U |
                -((local_58._1_1_ ^ 0x80) == bVar11) & 1U;
    pbVar1[2] = -((char)bVar12 < (char)(local_58._2_1_ ^ 0x80)) & 2U |
                -((local_58._2_1_ ^ 0x80) == bVar12) & 1U;
    pbVar1[3] = -((char)bVar13 < (char)(local_58._3_1_ ^ 0x80)) & 2U |
                -((local_58._3_1_ ^ 0x80) == bVar13) & 1U;
    pbVar1[4] = -((char)bVar4 < (char)(local_58._4_1_ ^ 0x80)) & 2U |
                -((local_58._4_1_ ^ 0x80) == bVar4) & 1U;
    pbVar1[5] = -((char)bVar11 < (char)(local_58._5_1_ ^ 0x80)) & 2U |
                -((local_58._5_1_ ^ 0x80) == bVar11) & 1U;
    pbVar1[6] = -((char)bVar12 < (char)(local_58._6_1_ ^ 0x80)) & 2U |
                -((local_58._6_1_ ^ 0x80) == bVar12) & 1U;
    pbVar1[7] = -((char)bVar13 < (char)(local_58._7_1_ ^ 0x80)) & 2U |
                -((local_58._7_1_ ^ 0x80) == bVar13) & 1U;
    pbVar1[8] = -((char)bVar4 < (char)((byte)uStack_50 ^ 0x80)) & 2U |
                -(((byte)uStack_50 ^ 0x80) == bVar4) & 1U;
    pbVar1[9] = -((char)bVar11 < (char)(uStack_50._1_1_ ^ 0x80)) & 2U |
                -((uStack_50._1_1_ ^ 0x80) == bVar11) & 1U;
    pbVar1[10] = -((char)bVar12 < (char)(uStack_50._2_1_ ^ 0x80)) & 2U |
                 -((uStack_50._2_1_ ^ 0x80) == bVar12) & 1U;
    pbVar1[0xb] = -((char)bVar13 < (char)(uStack_50._3_1_ ^ 0x80)) & 2U |
                  -((uStack_50._3_1_ ^ 0x80) == bVar13) & 1U;
    pbVar1[0xc] = -((char)bVar4 < (char)(uStack_50._4_1_ ^ 0x80)) & 2U |
                  -((uStack_50._4_1_ ^ 0x80) == bVar4) & 1U;
    pbVar1[0xd] = -((char)bVar11 < (char)(uStack_50._5_1_ ^ 0x80)) & 2U |
                  -((uStack_50._5_1_ ^ 0x80) == bVar11) & 1U;
    pbVar1[0xe] = -((char)bVar12 < (char)(uStack_50._6_1_ ^ 0x80)) & 2U |
                  -((uStack_50._6_1_ ^ 0x80) == bVar12) & 1U;
    pbVar1[0xf] = -((char)bVar13 < (char)(uStack_50._7_1_ ^ 0x80)) & 2U |
                  -((uStack_50._7_1_ ^ 0x80) == bVar13) & 1U;
    ppuVar7 = ppuVar7 + 0x10;
  }
  for (; ppuVar7 = local_38, uVar9 < N; uVar9 = uVar9 + 1) {
    bVar4 = get_char<unsigned_char>(strings[uVar9],depth);
    oracle[uVar9] = (bVar3 <= bVar4 && bVar4 != bVar3) * '\x02' | bVar4 == bVar3;
  }
  for (sVar5 = 0; N != sVar5; sVar5 = sVar5 + 1) {
    local_70._M_elems[oracle[sVar5]] = local_70._M_elems[oracle[sVar5]] + 1;
  }
  if (local_70._M_elems[2] + local_70._M_elems[1] + local_70._M_elems[0] == N) {
    local_58 = 0;
    local_40 = local_70._M_elems[0];
    uStack_50 = local_70._M_elems[0];
    local_48 = local_70._M_elems[1] + local_70._M_elems[0];
    for (sVar5 = 0; N != sVar5; sVar5 = sVar5 + 1) {
      puVar2 = strings[sVar5];
      lVar8 = (&local_58)[oracle[sVar5]];
      (&local_58)[oracle[sVar5]] = lVar8 + 1;
      ppuVar7[lVar8] = puVar2;
    }
    memcpy(strings,ppuVar7,N << 3);
    multikey_simd_b<unsigned_char>(strings,local_40,depth,ppuVar7,oracle);
    if (bVar3 != 0) {
      multikey_simd_b<unsigned_char>
                (strings + local_70._M_elems[0],local_70._M_elems[1],depth + 1,ppuVar7,oracle);
    }
    multikey_simd_b<unsigned_char>
              (strings + local_70._M_elems[0] + local_70._M_elems[1],local_70._M_elems[2],depth,
               ppuVar7,oracle);
    return;
  }
  __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                ,0x166,
                "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned char]"
               );
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}